

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg)

{
  uint uVar1;
  cmCompiledGeneratorExpression *pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar4;
  cmLocalGenerator *pcVar5;
  bool bVar6;
  ostream *poVar7;
  cmake *cmakeInstance;
  string *le;
  string *lang;
  string *li;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  inputExpression;
  string inputContent;
  cmGeneratorExpression contentGE;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  undefined1 local_478 [40];
  cmLocalGenerator *local_450;
  undefined1 local_448 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  *local_408;
  long local_400;
  unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  local_3f8 [2];
  cmListFileBacktrace local_3e8;
  string *local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  _Base_ptr local_228;
  _Base_ptr local_220;
  _Base_ptr local_218;
  size_t local_210;
  
  local_408 = local_3f8;
  local_400 = 0;
  local_3f8[0]._M_t.
  super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl._0_1_ = 0;
  local_450 = lg;
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&local_408);
  }
  else {
    GetInputFileName_abi_cxx11_((string *)local_448,this,lg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lg->Makefile->ListFiles,(value_type *)local_448);
    if (this->Permissions == 0) {
      cmsys::SystemTools::GetPermissions((char *)local_448._0_8_,&this->Permissions);
    }
    std::ifstream::ifstream(local_238,(char *)local_448._0_8_,_S_in);
    uVar1 = *(uint *)((long)&local_218 + (long)*(_func_int **)(local_238._0_8_ + -0x18));
    if ((uVar1 & 5) == 0) {
      local_3b0._0_8_ = local_3a0;
      local_3b0._8_8_ = (element_type *)0x0;
      local_3a0[0]._M_local_buf[0] = '\0';
      local_478._0_8_ = local_478 + 0x10;
      local_478._8_8_ = (string *)0x0;
      local_478._16_8_ = local_478._16_8_ & 0xffffffffffffff00;
      while (bVar6 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)local_238,(string *)local_3b0,(bool *)0x0,
                                0xffffffffffffffff), bVar6) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478,(string *)local_3b0);
        std::__cxx11::string::_M_append((char *)&local_408,local_428._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_allocated_capacity != &local_418) {
          operator_delete((void *)local_428._M_allocated_capacity,
                          local_418._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace((ulong)local_478,0,(char *)local_478._8_8_,0x7d5ebd);
      }
      std::__cxx11::string::_M_append((char *)&local_408,local_478._0_8_);
      if ((string *)local_478._0_8_ != (string *)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,
                        CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                 local_3a0[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Evaluation file \"",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,(char *)local_448._0_8_,local_448._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" cannot be read.",0x11);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(local_450,FATAL_ERROR,(string *)local_478);
      if ((string *)local_478._0_8_ != (string *)(local_478 + 0x10)) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    std::ifstream::~ifstream(local_238);
    if ((string *)local_448._0_8_ != (string *)(local_448 + 0x10)) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    if ((uVar1 & 5) != 0) goto LAB_00583b78;
  }
  pcVar2 = (this->OutputFileExpr)._M_t.
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  peVar3 = *(element_type **)
            &(pcVar2->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(pcVar2->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace> +
            8))->_M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  cmakeInstance = cmLocalGenerator::GetCMakeInstance(local_450);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_3e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar3;
  local_3e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this_00;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_3b0,cmakeInstance,&local_3e8);
  if (local_3e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3d0,local_408,
             (long)&(local_408->_M_t).
                    super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                    .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl +
             local_400);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_428,(string *)local_3b0);
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  pcVar5 = local_450;
  local_220 = (_Base_ptr)(local_238 + 8);
  local_238._8_4_ = _S_red;
  local_228 = (_Base_ptr)0x0;
  local_210 = 0;
  local_218 = local_220;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_448,local_450->Makefile,IncludeEmptyConfig);
  local_478._0_8_ = (string *)0x0;
  local_478._8_8_ = (string *)0x0;
  local_478._16_8_ = 0;
  cmGlobalGenerator::GetEnabledLanguages
            (pcVar5->GlobalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_478);
  local_3d8 = (string *)local_478._8_8_;
  if (local_478._0_8_ != local_478._8_8_) {
    config = (string *)local_448._0_8_;
    psVar4 = (string *)local_448._8_8_;
    lang = (string *)local_478._0_8_;
    do {
      for (; config != psVar4; config = config + 1) {
        Generate(this,local_450,config,lang,
                 (cmCompiledGeneratorExpression *)local_428._M_allocated_capacity,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_238,this->Permissions);
        if ((cmSystemTools::s_FatalErrorOccurred != false) ||
           (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) goto LAB_00583b31;
      }
      lang = lang + 1;
      config = (string *)local_448._0_8_;
      psVar4 = (string *)local_448._8_8_;
    } while (lang != local_3d8);
  }
LAB_00583b31:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_448);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_238);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_428._M_allocated_capacity);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_3b0);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00583b78:
  if (local_408 != local_3f8) {
    operator_delete(local_408,
                    CONCAT71(local_3f8[0]._M_t.
                             super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                             .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>.
                             _M_head_impl._1_7_,
                             local_3f8[0]._M_t.
                             super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                             .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>.
                             _M_head_impl._0_1_) + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(cmLocalGenerator* lg)
{
  std::string inputContent;
  if (this->InputIsContent) {
    inputContent = this->Input;
  } else {
    const std::string inputFileName = this->GetInputFileName(lg);
    lg->GetMakefile()->AddCMakeDependFile(inputFileName);
    if (!this->Permissions) {
      cmSystemTools::GetPermissions(inputFileName.c_str(), this->Permissions);
    }
    cmsys::ifstream fin(inputFileName.c_str());
    if (!fin) {
      std::ostringstream e;
      e << "Evaluation file \"" << inputFileName << "\" cannot be read.";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }

    std::string line;
    std::string sep;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      inputContent += sep + line;
      sep = "\n";
    }
    inputContent += sep;
  }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(*lg->GetCMakeInstance(), lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> inputExpression =
    contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs =
    lg->GetMakefile()->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for (std::string const& le : enabledLanguages) {
    for (std::string const& li : allConfigs) {
      this->Generate(lg, li, le, inputExpression.get(), outputFiles,
                     this->Permissions);
      if (cmSystemTools::GetFatalErrorOccurred()) {
        return;
      }
    }
  }
}